

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::anon_unknown_0::ComparisonTest_RepeatedSetFieldTest_Test::TestBody
          (ComparisonTest_RepeatedSetFieldTest_Test *this)

{
  RepeatedPtrField<proto2_unittest::TestAllTypes_RepeatedGroup> *this_00;
  RepeatedPtrField<proto2_unittest::TestAllTypes_RepeatedGroup> *this_01;
  void *pvVar1;
  char *message;
  string local_70;
  AssertHelper local_50;
  internal local_48 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  TestAllTypes *local_38;
  
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"repeatedgroup","");
  std::__cxx11::string::_M_assign((string *)&(this->super_ComparisonTest).set_field_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  local_38 = &(this->super_ComparisonTest).proto1_;
  this_00 = &(this->super_ComparisonTest).proto1_.field_0._impl_.repeatedgroup_;
  protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypes_RepeatedGroup>>
            (&this_00->super_RepeatedPtrFieldBase);
  this_01 = &(this->super_ComparisonTest).proto2_.field_0._impl_.repeatedgroup_;
  protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypes_RepeatedGroup>>
            (&this_01->super_RepeatedPtrFieldBase);
  pvVar1 = protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     (&this_01->super_RepeatedPtrFieldBase,
                      Arena::DefaultConstruct<proto2_unittest::TestAllTypes_RepeatedGroup>);
  *(undefined4 *)((long)pvVar1 + 0x18) = 0x38d;
  *(byte *)((long)pvVar1 + 0x10) = *(byte *)((long)pvVar1 + 0x10) | 1;
  pvVar1 = protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     (&this_01->super_RepeatedPtrFieldBase,
                      Arena::DefaultConstruct<proto2_unittest::TestAllTypes_RepeatedGroup>);
  *(undefined4 *)((long)pvVar1 + 0x18) = 0x38b;
  *(byte *)((long)pvVar1 + 0x10) = *(byte *)((long)pvVar1 + 0x10) | 1;
  pvVar1 = protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     (&this_00->super_RepeatedPtrFieldBase,
                      Arena::DefaultConstruct<proto2_unittest::TestAllTypes_RepeatedGroup>);
  *(undefined4 *)((long)pvVar1 + 0x18) = 0x13d;
  *(byte *)((long)pvVar1 + 0x10) = *(byte *)((long)pvVar1 + 0x10) | 1;
  pvVar1 = protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     (&this_00->super_RepeatedPtrFieldBase,
                      Arena::DefaultConstruct<proto2_unittest::TestAllTypes_RepeatedGroup>);
  *(undefined4 *)((long)pvVar1 + 0x18) = 0x388;
  *(byte *)((long)pvVar1 + 0x10) = *(byte *)((long)pvVar1 + 0x10) | 1;
  pvVar1 = protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     (&this_00->super_RepeatedPtrFieldBase,
                      Arena::DefaultConstruct<proto2_unittest::TestAllTypes_RepeatedGroup>);
  *(undefined4 *)((long)pvVar1 + 0x18) = 0x38b;
  *(byte *)((long)pvVar1 + 0x10) = *(byte *)((long)pvVar1 + 0x10) | 1;
  pvVar1 = protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     (&this_00->super_RepeatedPtrFieldBase,
                      Arena::DefaultConstruct<proto2_unittest::TestAllTypes_RepeatedGroup>);
  *(undefined4 *)((long)pvVar1 + 0x18) = 0x38d;
  *(byte *)((long)pvVar1 + 0x10) = *(byte *)((long)pvVar1 + 0x10) | 1;
  protobuf::(anonymous_namespace)::ComparisonTest::Run_abi_cxx11_
            (&local_70,this,&local_38->super_Message,
             &(this->super_ComparisonTest).proto2_.super_Message);
  testing::internal::CmpHelperEQ<char[191],std::__cxx11::string>
            (local_48,
             "\"moved: repeatedgroup[2] -> repeatedgroup[1] : { a: 907 }\\n\" \"moved: repeatedgroup[3] -> repeatedgroup[0] : { a: 909 }\\n\" \"deleted: repeatedgroup[0]: { a: 317 }\\n\" \"deleted: repeatedgroup[1]: { a: 904 }\\n\""
             ,"Run()",(char (*) [191])
                      "moved: repeatedgroup[2] -> repeatedgroup[1] : { a: 907 }\nmoved: repeatedgroup[3] -> repeatedgroup[0] : { a: 909 }\ndeleted: repeatedgroup[0]: { a: 317 }\ndeleted: repeatedgroup[1]: { a: 904 }\n"
             ,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_70);
    if (local_40 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = anon_var_dwarf_a22956 + 5;
    }
    else {
      message = (local_40->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0xd3b,message);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_70._M_dataplus._M_p + 8))();
    }
  }
  if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_40,local_40);
  }
  return;
}

Assistant:

TEST_F(ComparisonTest, RepeatedSetFieldTest) {
  field_as_set("repeatedgroup");

  proto1_.clear_repeatedgroup();
  proto2_.clear_repeatedgroup();
  proto2_.add_repeatedgroup()->set_a(909);
  proto2_.add_repeatedgroup()->set_a(907);
  proto1_.add_repeatedgroup()->set_a(317);
  proto1_.add_repeatedgroup()->set_a(904);
  proto1_.add_repeatedgroup()->set_a(907);
  proto1_.add_repeatedgroup()->set_a(909);

  EXPECT_EQ(
      "moved: repeatedgroup[2] -> repeatedgroup[1] : { a: 907 }\n"
      "moved: repeatedgroup[3] -> repeatedgroup[0] : { a: 909 }\n"
      "deleted: repeatedgroup[0]: { a: 317 }\n"
      "deleted: repeatedgroup[1]: { a: 904 }\n",
      Run());
}